

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O3

Gia_Obj_t * Gia_ManAppendObj(Gia_Man_t *p)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  uint *puVar3;
  uint uVar4;
  long lVar5;
  
  uVar4 = p->nObjs;
  if (uVar4 == p->nObjsAlloc) {
    uVar1 = uVar4 * 2;
    if (0x1fffffff < (int)(uVar4 * 2)) {
      uVar1 = 0x20000000;
    }
    if (uVar4 == 0x20000000) {
      puts("Hard limit on the number of nodes (2^29) is reached. Quitting...");
      exit(1);
    }
    if ((int)uVar1 <= (int)uVar4) {
      __assert_fail("p->nObjs < nObjNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                    ,0x24c,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
    }
    if (p->fVerbose != 0) {
      printf("Extending GIA object storage: %d -> %d.\n",(ulong)uVar4,(ulong)uVar1);
      uVar4 = p->nObjsAlloc;
    }
    if ((int)uVar4 < 1) {
      __assert_fail("p->nObjsAlloc > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                    ,0x24f,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
    }
    lVar5 = (long)(int)uVar1;
    if (p->pObjs == (Gia_Obj_t *)0x0) {
      pGVar2 = (Gia_Obj_t *)malloc(lVar5 * 0xc);
    }
    else {
      pGVar2 = (Gia_Obj_t *)realloc(p->pObjs,lVar5 * 0xc);
      uVar4 = p->nObjsAlloc;
    }
    p->pObjs = pGVar2;
    memset(pGVar2 + (int)uVar4,0,(long)(int)(uVar1 - uVar4) * 0xc);
    if (p->pMuxes != (uint *)0x0) {
      puVar3 = (uint *)realloc(p->pMuxes,lVar5 * 4);
      p->pMuxes = puVar3;
      memset(puVar3 + p->nObjsAlloc,0,(lVar5 - p->nObjsAlloc) * 4);
    }
    p->nObjsAlloc = uVar1;
    uVar4 = p->nObjs;
  }
  p->nObjs = uVar4 + 1;
  if (-1 < (int)uVar4) {
    return p->pObjs + uVar4;
  }
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

static inline Gia_Obj_t * Gia_ManAppendObj( Gia_Man_t * p )  
{ 
    if ( p->nObjs == p->nObjsAlloc )
    {
        int nObjNew = Abc_MinInt( 2 * p->nObjsAlloc, (1 << 29) );
        if ( p->nObjs == (1 << 29) )
            printf( "Hard limit on the number of nodes (2^29) is reached. Quitting...\n" ), exit(1);
        assert( p->nObjs < nObjNew );
        if ( p->fVerbose )
            printf("Extending GIA object storage: %d -> %d.\n", p->nObjsAlloc, nObjNew );
        assert( p->nObjsAlloc > 0 );
        p->pObjs = ABC_REALLOC( Gia_Obj_t, p->pObjs, nObjNew );
        memset( p->pObjs + p->nObjsAlloc, 0, sizeof(Gia_Obj_t) * (nObjNew - p->nObjsAlloc) );
        if ( p->pMuxes )
        {
            p->pMuxes = ABC_REALLOC( unsigned, p->pMuxes, nObjNew );
            memset( p->pMuxes + p->nObjsAlloc, 0, sizeof(unsigned) * (nObjNew - p->nObjsAlloc) );
        }
        p->nObjsAlloc = nObjNew;
    }
    return Gia_ManObj( p, p->nObjs++ );
}